

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeUpdateMeta(Btree *p,int idx,u32 iMeta)

{
  BtShared *pBVar1;
  u8 *puVar2;
  int iVar3;
  int rc;
  uchar *pP1;
  BtShared *pBt;
  u32 iMeta_local;
  int idx_local;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  puVar2 = pBVar1->pPage1->aData;
  iVar3 = sqlite3PagerWrite(pBVar1->pPage1->pDbPage);
  if ((iVar3 == 0) && (sqlite3Put4byte(puVar2 + (idx * 4 + 0x24),iMeta), idx == 7)) {
    pBVar1->incrVacuum = (u8)iMeta;
  }
  sqlite3BtreeLeave(p);
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeUpdateMeta(Btree *p, int idx, u32 iMeta){
  BtShared *pBt = p->pBt;
  unsigned char *pP1;
  int rc;
  assert( idx>=1 && idx<=15 );
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );
  assert( pBt->pPage1!=0 );
  pP1 = pBt->pPage1->aData;
  rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
  if( rc==SQLITE_OK ){
    put4byte(&pP1[36 + idx*4], iMeta);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( idx==BTREE_INCR_VACUUM ){
      assert( pBt->autoVacuum || iMeta==0 );
      assert( iMeta==0 || iMeta==1 );
      pBt->incrVacuum = (u8)iMeta;
    }
#endif
  }
  sqlite3BtreeLeave(p);
  return rc;
}